

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm.c
# Opt level: O0

int build_code(BuildCtx *ctx)

{
  int iVar1;
  void **ppvVar2;
  char **ppcVar3;
  uint8_t *puVar4;
  char *pcVar5;
  BuildSym *pBVar6;
  int32_t *piVar7;
  size_t sVar8;
  int len;
  char *gl;
  uint local_20;
  int32_t ofs;
  int i;
  int status;
  BuildCtx *ctx_local;
  
  ctx->nglob = 0x9e;
  ppvVar2 = (void **)malloc((long)ctx->nglob << 3);
  ctx->glob = ppvVar2;
  memset(ctx->glob,0,(long)ctx->nglob << 3);
  ctx->nreloc = 0;
  ctx->globnames = globnames;
  ctx->extnames = extnames;
  ppcVar3 = (char **)malloc(0x1e0);
  ctx->relocsym = ppcVar3;
  ctx->nrelocsym = 0;
  for (local_20 = 0; (int)local_20 < 0x3c; local_20 = local_20 + 1) {
    relocmap[(int)local_20] = -1;
  }
  ctx->dasm_ident = "DynASM 1.5.0";
  ctx->dasm_arch = "x86";
  dasm_init(ctx,2);
  dasm_setupglobal(ctx,ctx->glob,ctx->nglob);
  dasm_setup(ctx,build_actionlist);
  iVar1 = build_backend(ctx);
  ctx->npc = iVar1;
  dasm_checkstep(ctx,-1);
  ctx_local._4_4_ = dasm_link(ctx,&ctx->codesz);
  if (ctx_local._4_4_ == 0) {
    puVar4 = (uint8_t *)malloc(ctx->codesz);
    ctx->code = puVar4;
    ctx_local._4_4_ = dasm_encode(ctx,ctx->code);
    if (ctx_local._4_4_ == 0) {
      pcVar5 = sym_decorate(ctx,"","lj_vm_asm_begin");
      ctx->beginsym = pcVar5;
      pBVar6 = (BuildSym *)malloc((long)(ctx->npc + ctx->nglob + 1) << 4);
      ctx->sym = pBVar6;
      ctx->nsym = 0;
      piVar7 = (int32_t *)malloc((long)ctx->npc << 2);
      ctx->bc_ofs = piVar7;
      for (local_20 = 0; (int)local_20 < ctx->npc; local_20 = local_20 + 1) {
        iVar1 = dasm_getpclabel(ctx,local_20);
        if (iVar1 < 0) {
          return local_20 | 0x22000000;
        }
        ctx->bc_ofs[(int)local_20] = iVar1;
        sym_insert(ctx,iVar1,"lj_BC_",bc_names[(int)local_20]);
      }
      for (local_20 = 0; (int)local_20 < ctx->nglob; local_20 = local_20 + 1) {
        pcVar5 = globnames[(int)local_20];
        sVar8 = strlen(pcVar5);
        iVar1 = (int)sVar8;
        if (ctx->glob[(int)local_20] == (void *)0x0) {
          fprintf(_stderr,"Error: undefined global %s\n",pcVar5);
          exit(2);
        }
        if (((iVar1 < 2) || (pcVar5[iVar1 + -2] != '_')) || (pcVar5[iVar1 + -1] != 'Z')) {
          sym_insert(ctx,(int)ctx->glob[(int)local_20] - (int)ctx->code,"lj_",
                     globnames[(int)local_20]);
        }
      }
      sym_insert(ctx,(int32_t)ctx->codesz,"","");
      ctx->nsym = ctx->nsym + -1;
      dasm_free(ctx);
      ctx_local._4_4_ = 0;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static int build_code(BuildCtx *ctx)
{
  int status;
  int i;

  /* Initialize DynASM structures. */
  ctx->nglob = GLOB__MAX;
  ctx->glob = (void **)malloc(ctx->nglob*sizeof(void *));
  memset(ctx->glob, 0, ctx->nglob*sizeof(void *));
  ctx->nreloc = 0;

  ctx->globnames = globnames;
  ctx->extnames = extnames;
  ctx->relocsym = (const char **)malloc(NRELOCSYM*sizeof(const char *));
  ctx->nrelocsym = 0;
  for (i = 0; i < (int)NRELOCSYM; i++) relocmap[i] = -1;

  ctx->dasm_ident = DASM_IDENT;
  ctx->dasm_arch = DASM_ARCH;

  dasm_init(Dst, DASM_MAXSECTION);
  dasm_setupglobal(Dst, ctx->glob, ctx->nglob);
  dasm_setup(Dst, build_actionlist);

  /* Call arch-specific backend to emit the code. */
  ctx->npc = build_backend(ctx);

  /* Finalize the code. */
  (void)dasm_checkstep(Dst, -1);
  if ((status = dasm_link(Dst, &ctx->codesz))) return status;
  ctx->code = (uint8_t *)malloc(ctx->codesz);
  if ((status = dasm_encode(Dst, (void *)ctx->code))) return status;

  /* Allocate symbol table and bytecode offsets. */
  ctx->beginsym = sym_decorate(ctx, "", LABEL_PREFIX "vm_asm_begin");
  ctx->sym = (BuildSym *)malloc((ctx->npc+ctx->nglob+1)*sizeof(BuildSym));
  ctx->nsym = 0;
  ctx->bc_ofs = (int32_t *)malloc(ctx->npc*sizeof(int32_t));

  /* Collect the opcodes (PC labels). */
  for (i = 0; i < ctx->npc; i++) {
    int32_t ofs = dasm_getpclabel(Dst, i);
    if (ofs < 0) return 0x22000000|i;
    ctx->bc_ofs[i] = ofs;
    if ((LJ_HASJIT ||
	 !(i == BC_JFORI || i == BC_JFORL || i == BC_JITERL || i == BC_JLOOP ||
	   i == BC_IFORL || i == BC_IITERL || i == BC_ILOOP)) &&
	(LJ_HASFFI || i != BC_KCDATA))
      sym_insert(ctx, ofs, LABEL_PREFIX_BC, bc_names[i]);
  }

  /* Collect the globals (named labels). */
  for (i = 0; i < ctx->nglob; i++) {
    const char *gl = globnames[i];
    int len = (int)strlen(gl);
    if (!ctx->glob[i]) {
      fprintf(stderr, "Error: undefined global %s\n", gl);
      exit(2);
    }
    /* Skip the _Z symbols. */
    if (!(len >= 2 && gl[len-2] == '_' && gl[len-1] == 'Z'))
      sym_insert(ctx, (int32_t)((uint8_t *)(ctx->glob[i]) - ctx->code),
		 LABEL_PREFIX, globnames[i]);
  }

  /* Close the address range. */
  sym_insert(ctx, (int32_t)ctx->codesz, "", "");
  ctx->nsym--;

  dasm_free(Dst);

  return 0;
}